

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest41
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  string *psVar1;
  bool bVar2;
  Application *pAVar3;
  FieldBase *pFVar4;
  FieldBase *pFVar5;
  FieldBase local_230;
  FieldBase local_1d8;
  FieldBase local_180;
  FieldBase local_128;
  FieldBase local_d0;
  FieldBase local_78;
  
  pAVar3 = this;
  queryOrigClOrdID((OrigClOrdID *)&local_230,this);
  queryClOrdID((ClOrdID *)&local_d0,pAVar3);
  pAVar3 = (Application *)0x15;
  FIX::CharField::CharField((CharField *)&local_1d8,0x15,'1');
  local_1d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00161ea0;
  querySymbol((Symbol *)&local_128,pAVar3);
  querySide((Side *)&local_180,pAVar3);
  queryOrdType((OrdType *)&local_78,pAVar3);
  FIX41::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,(OrigClOrdID *)&local_230,(ClOrdID *)&local_d0,
             (HandlInst *)&local_1d8,(Symbol *)&local_128,(Side *)&local_180,(OrdType *)&local_78);
  FIX::FieldBase::~FieldBase(&local_78);
  FIX::FieldBase::~FieldBase(&local_180);
  FIX::FieldBase::~FieldBase(&local_128);
  FIX::FieldBase::~FieldBase(&local_1d8);
  FIX::FieldBase::~FieldBase(&local_d0);
  FIX::FieldBase::~FieldBase(&local_230);
  psVar1 = &local_230.m_string;
  pFVar5 = &local_230;
  local_230._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pFVar5,"New price","");
  pFVar4 = &local_230;
  bVar2 = queryConfirm((Application *)pFVar5,(string *)pFVar4);
  if ((string *)local_230._vptr_FieldBase != psVar1) {
    pFVar4 = (FieldBase *)(local_230.m_string._M_dataplus._M_p + 1);
    operator_delete(local_230._vptr_FieldBase,(ulong)pFVar4);
  }
  if (bVar2) {
    queryPrice((Price *)&local_230,(Application *)pFVar4);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_230,true);
    FIX::FieldBase::~FieldBase(&local_230);
  }
  pFVar5 = &local_230;
  local_230._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pFVar5,"New quantity","");
  pFVar4 = &local_230;
  bVar2 = queryConfirm((Application *)pFVar5,(string *)pFVar4);
  if ((string *)local_230._vptr_FieldBase != psVar1) {
    pFVar4 = (FieldBase *)(local_230.m_string._M_dataplus._M_p + 1);
    operator_delete(local_230._vptr_FieldBase,(ulong)pFVar4);
  }
  if (bVar2) {
    queryOrderQty((OrderQty *)&local_230,(Application *)pFVar4);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_230,true);
    FIX::FieldBase::~FieldBase(&local_230);
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX41::OrderCancelReplaceRequest Application::queryCancelReplaceRequest41() {
  FIX41::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      queryOrdType());

  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}